

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

void run_container_union_inplace(run_container_t *src_1,run_container_t *src_2)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t rVar3;
  rle16_t rVar4;
  rle16_t *prVar5;
  int iVar6;
  rle16_t *prVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  
  iVar6 = src_1->n_runs;
  prVar7 = src_1->runs;
  bVar16 = false;
  if ((iVar6 == 1) && (bVar16 = false, prVar7->value == 0)) {
    bVar16 = prVar7->length == 0xffff;
  }
  bVar17 = false;
  if ((src_2->n_runs == 1) && (bVar17 = false, src_2->runs->value == 0)) {
    bVar17 = src_2->runs->length == 0xffff;
  }
  if ((bool)(bVar16 | bVar17)) {
    if (bVar16) {
      return;
    }
    if (bVar17) {
      run_container_copy(src_2,src_1);
      return;
    }
  }
  iVar14 = src_2->n_runs + iVar6;
  if (src_1->capacity < iVar14 + iVar6) {
    run_container_grow(src_1,iVar14 + iVar6,true);
    prVar7 = src_1->runs;
    iVar6 = src_1->n_runs;
  }
  memmove(prVar7 + iVar14,prVar7,(long)iVar6 << 2);
  prVar7 = src_1->runs + iVar14;
  iVar6 = src_1->n_runs;
  src_1->n_runs = 0;
  uVar1 = src_2->runs->value;
  uVar2 = prVar7->value;
  uVar8 = (ulong)(uVar2 <= uVar1);
  uVar15 = (uint)(uVar2 <= uVar1);
  prVar5 = src_2->runs;
  if (uVar2 <= uVar1) {
    prVar5 = prVar7;
  }
  uVar11 = (ulong)(uVar1 < uVar2);
  rVar4 = *prVar5;
  *src_1->runs = rVar4;
  src_1->n_runs = src_1->n_runs + 1;
  uVar9 = (uint)rVar4 >> 0x10;
  iVar14 = src_2->n_runs;
  uVar10 = (uint)(uVar1 < uVar2);
  if ((int)uVar15 < iVar6 && (int)uVar10 < iVar14) {
    do {
      uVar1 = prVar7[uVar8].value;
      uVar2 = src_2->runs[uVar11].value;
      prVar5 = prVar7 + uVar8;
      if (uVar2 < uVar1) {
        prVar5 = src_2->runs + uVar11;
      }
      rVar3 = *prVar5;
      uVar15 = (uint)rVar4 & 0xffff;
      if (uVar15 + (uVar9 & 0xffff) + 1 < ((uint)rVar3 & 0xffff)) {
        prVar5 = src_1->runs;
        iVar14 = src_1->n_runs;
        prVar5[iVar14].value = rVar3.value;
        prVar5[iVar14].length = rVar3.length;
        src_1->n_runs = iVar14 + 1;
        rVar4 = rVar3;
        uVar9 = (uint)rVar3 >> 0x10;
      }
      else {
        uVar10 = ((uint)rVar3 & 0xffff) + ((uint)rVar3 >> 0x10);
        if ((uVar9 & 0xffff) + uVar15 <= uVar10) {
          uVar9 = uVar10 - uVar15;
          src_1->runs[(long)src_1->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | uVar15);
        }
      }
      uVar10 = (int)uVar11 + (uint)(uVar2 < uVar1);
      uVar11 = (ulong)uVar10;
      uVar15 = (int)uVar8 + (uint)(uVar1 <= uVar2);
      uVar8 = (ulong)uVar15;
      iVar14 = src_2->n_runs;
    } while (((int)uVar10 < iVar14) && ((int)uVar15 < iVar6));
  }
  if ((int)uVar10 < iVar14) {
    lVar12 = (long)(int)uVar10;
    do {
      rVar3 = src_2->runs[lVar12];
      uVar10 = (uint)rVar4 & 0xffff;
      if (uVar10 + (uVar9 & 0xffff) + 1 < ((uint)rVar3 & 0xffff)) {
        prVar5 = src_1->runs;
        iVar14 = src_1->n_runs;
        prVar5[iVar14].value = rVar3.value;
        prVar5[iVar14].length = rVar3.length;
        src_1->n_runs = iVar14 + 1;
        rVar4 = rVar3;
        uVar9 = (uint)rVar3 >> 0x10;
      }
      else {
        uVar13 = ((uint)rVar3 & 0xffff) + ((uint)rVar3 >> 0x10);
        if ((uVar9 & 0xffff) + uVar10 <= uVar13) {
          uVar9 = uVar13 - uVar10;
          src_1->runs[(long)src_1->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | uVar10);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < src_2->n_runs);
  }
  if ((int)uVar15 < iVar6) {
    lVar12 = (long)(int)uVar15;
    do {
      rVar3 = prVar7[lVar12];
      uVar15 = (uint)rVar4 & 0xffff;
      if (uVar15 + (uVar9 & 0xffff) + 1 < ((uint)rVar3 & 0xffff)) {
        prVar5 = src_1->runs;
        iVar14 = src_1->n_runs;
        prVar5[iVar14].value = rVar3.value;
        prVar5[iVar14].length = rVar3.length;
        src_1->n_runs = iVar14 + 1;
        rVar4 = rVar3;
        uVar9 = (uint)rVar3 >> 0x10;
      }
      else {
        uVar10 = ((uint)rVar3 & 0xffff) + ((uint)rVar3 >> 0x10);
        if ((uVar9 & 0xffff) + uVar15 <= uVar10) {
          uVar9 = uVar10 - uVar15;
          src_1->runs[(long)src_1->n_runs + -1] = (rle16_t)(uVar9 * 0x10000 | uVar15);
        }
      }
      lVar12 = lVar12 + 1;
    } while (iVar6 != lVar12);
  }
  return;
}

Assistant:

void run_container_union_inplace(run_container_t *src_1,
                                 const run_container_t *src_2) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            return;
        }
        if (if2) {
            run_container_copy(src_2, src_1);
            return;
        }
    }
    // we move the data to the end of the current array
    const int32_t maxoutput = src_1->n_runs + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_1->n_runs;
    if (src_1->capacity < neededcapacity)
        run_container_grow(src_1, neededcapacity, true);
    memmove(src_1->runs + maxoutput, src_1->runs,
            src_1->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc1 = src_1->runs + maxoutput;
    const int32_t input1nruns = src_1->n_runs;
    src_1->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(src_1, inputsrc1[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(src_1, src_2->runs[xrlepos]);
        xrlepos++;
    }
    while ((xrlepos < src_2->n_runs) && (rlepos < input1nruns)) {
        rle16_t newrl;
        if (inputsrc1[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = inputsrc1[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(src_1, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(src_1, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < input1nruns) {
        run_container_append(src_1, inputsrc1[rlepos], &previousrle);
        rlepos++;
    }
}